

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint inflatev(ucvector *out,uchar *in,size_t insize,LodePNGDecompressSettings *settings)

{
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  LodePNGDecompressSettings *unaff_retaddr;
  size_t in_stack_00000008;
  uint error;
  uint local_2c;
  uint local_4;
  
  if (*(long *)(in_RCX + 0x18) == 0) {
    local_4 = lodepng_inflatev((ucvector *)insize,(uchar *)settings,in_stack_00000008,unaff_retaddr)
    ;
  }
  else {
    local_2c = (**(code **)(in_RCX + 0x18))(in_RDI,in_RDI + 8,in_RSI,in_RDX,in_RCX);
    *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_RDI + 8);
    if (((local_2c != 0) && (local_2c = 0x6e, *(long *)(in_RCX + 8) != 0)) &&
       (*(ulong *)(in_RCX + 8) < *(ulong *)(in_RDI + 8))) {
      local_2c = 0x6d;
    }
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

static unsigned inflatev(ucvector* out, const unsigned char* in, size_t insize,
                        const LodePNGDecompressSettings* settings) {
  if(settings->custom_inflate) {
    unsigned error = settings->custom_inflate(&out->data, &out->size, in, insize, settings);
    out->allocsize = out->size;
    if(error) {
      /*the custom inflate is allowed to have its own error codes, however, we translate it to code 110*/
      error = 110;
      /*if there's a max output size, and the custom zlib returned error, then indicate that error instead*/
      if(settings->max_output_size && out->size > settings->max_output_size) error = 109;
    }
    return error;
  } else {
    return lodepng_inflatev(out, in, insize, settings);
  }
}